

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Glucose::Solver::toDimacs(Solver *this,FILE *f,vec<Glucose::Lit> *assumps)

{
  uint uVar1;
  uint *puVar2;
  FILE *f_00;
  bool bVar3;
  Var VVar4;
  ulong uVar5;
  char *pcVar6;
  int i;
  long lVar7;
  long lVar8;
  int i_1;
  int iVar9;
  int i_3;
  lbool local_59;
  Var max;
  uint local_54;
  FILE *local_50;
  vec<int> map;
  
  if (this->ok != false) {
    max = 0;
    map.data = (int *)0x0;
    map.sz = 0;
    map.cap = 0;
    iVar9 = 0;
    for (lVar7 = 0; uVar5 = (ulong)(this->clauses).sz, lVar7 < (long)uVar5; lVar7 = lVar7 + 1) {
      bVar3 = satisfied(this,(Clause *)
                             ((this->ca).super_RegionAllocator<unsigned_int>.memory +
                             (this->clauses).data[lVar7]));
      iVar9 = iVar9 + (uint)!bVar3;
    }
    local_54 = iVar9;
    local_50 = (FILE *)f;
    for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
      bVar3 = satisfied(this,(Clause *)
                             ((this->ca).super_RegionAllocator<unsigned_int>.memory +
                             (this->clauses).data[lVar7]));
      if (!bVar3) {
        uVar1 = (this->clauses).data[lVar7];
        puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        for (lVar8 = 0; lVar8 < (int)puVar2[(ulong)uVar1 + 1]; lVar8 = lVar8 + 1) {
          local_59.value =
               (byte)puVar2[(ulong)uVar1 + lVar8 + 3] & 1 ^
               (this->assigns).data[(int)puVar2[(ulong)uVar1 + lVar8 + 3] >> 1].value;
          bVar3 = lbool::operator!=(&local_59,(lbool)0x1);
          if (bVar3) {
            mapVar((int)puVar2[(ulong)uVar1 + lVar8 + 3] >> 1,&map,&max);
          }
        }
      }
      uVar5 = (ulong)(uint)(this->clauses).sz;
    }
    local_54 = local_54 + (this->assumptions).sz;
    fprintf(local_50,"p cnf %d %d\n",(ulong)(uint)max);
    for (lVar7 = 0; f_00 = local_50, lVar7 < (this->assumptions).sz; lVar7 = lVar7 + 1) {
      uVar1 = (this->assumptions).data[lVar7].x;
      VVar4 = mapVar((int)uVar1 >> 1,&map,&max);
      pcVar6 = "-";
      if ((uVar1 & 1) == 0) {
        pcVar6 = "";
      }
      fprintf(local_50,"%s%d 0\n",pcVar6,(ulong)(VVar4 + 1));
    }
    for (lVar7 = 0; lVar7 < (this->clauses).sz; lVar7 = lVar7 + 1) {
      toDimacs(this,(FILE *)f_00,
               (Clause *)
               ((this->ca).super_RegionAllocator<unsigned_int>.memory + (this->clauses).data[lVar7])
               ,&map,&max);
    }
    if (0 < this->verbosity) {
      printf("Wrote %d clauses with %d variables.\n",(ulong)local_54,(ulong)(uint)max);
    }
    vec<int>::~vec(&map);
    return;
  }
  fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, const vec <Lit> &assumps) {
    // Handle case when solver is in contradictory state:
    if(!ok) {
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return;
    }

    vec <Var> map;
    Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for(int i = 0; i < clauses.size(); i++)
        if(!satisfied(ca[clauses[i]]))
            cnt++;

    for(int i = 0; i < clauses.size(); i++)
        if(!satisfied(ca[clauses[i]])) {
            Clause &c = ca[clauses[i]];
            for(int j = 0; j < c.size(); j++)
                if(value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for(int i = 0; i < assumptions.size(); i++) {
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max) + 1);
    }

    for(int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if(verbosity > 0)
        printf("Wrote %d clauses with %d variables.\n", cnt, max);
}